

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngunknown.c
# Opt level: O1

int main(int argc,char **argv)

{
  char **ppcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FILE *pFVar6;
  char **ppcVar7;
  char **ppcVar8;
  char *pcVar9;
  char *pcVar10;
  uint argc_00;
  char **ppcVar11;
  char *count_argv;
  png_uint_32 default_flags [4];
  display d;
  char *local_170;
  char *local_160;
  png_uint_32 local_158 [6];
  display local_140;
  
  local_160 = "default=save";
  pcVar9 = *argv;
  memset(&local_140,0,0x110);
  local_140.test = "initialization";
  ppcVar8 = argv + 1;
  iVar5 = argc + -1;
  local_140.program = pcVar9;
  local_140.file = pcVar9;
  if (argc < 2) {
    bVar3 = true;
    local_170 = (char *)0x0;
    bVar2 = false;
  }
  else {
    bVar3 = false;
    bVar2 = false;
    local_170 = (char *)0x0;
    do {
      pcVar10 = argv[1];
      iVar4 = strcmp(pcVar10,"--strict");
      if (iVar4 == 0) {
        bVar3 = true;
        argv = ppcVar8;
        argc = iVar5;
      }
      else {
        iVar4 = strcmp(pcVar10,"--default");
        if (iVar4 == 0) {
          bVar2 = true;
          argv = ppcVar8;
          argc = iVar5;
        }
        else {
          iVar4 = strcmp(pcVar10,"--touch");
          if (iVar4 != 0) break;
          if (argc == 2) {
            pcVar10 = "--touch: missing file name";
            goto LAB_001029dc;
          }
          local_170 = argv[2];
          argv = argv + 2;
          argc = argc + -2;
        }
      }
      ppcVar8 = argv + 1;
      iVar5 = argc + -1;
    } while (1 < argc);
    bVar3 = !bVar3;
  }
  if (argc < 2) {
    pcVar10 = "missing test file";
LAB_001029dc:
    usage(pcVar9,pcVar10);
  }
  if ((bool)(iVar5 != 1 & bVar2)) {
    pcVar10 = "extra arguments";
    goto LAB_001029dc;
  }
  argc_00 = argc - 2;
  local_140.file = ppcVar8[argc_00];
  pFVar6 = fopen(local_140.file,"rb");
  if (pFVar6 == (FILE *)0x0) {
    main_cold_4();
LAB_00102a00:
    main_cold_1();
  }
  else {
    iVar5 = check((FILE *)pFVar6,1,&local_160,local_158,&local_140,0);
    if (iVar5 != 3) goto LAB_00102a00;
    if (bVar2) {
      if (standard_tests[0] != (char *)0x0) {
        ppcVar8 = standard_tests;
        pcVar9 = standard_tests[0];
        do {
          iVar4 = 0;
          iVar5 = 0;
          if (!bVar3) {
            iVar5 = local_140.warning_count;
          }
          ppcVar11 = ppcVar8;
          if (ppcVar8[1] != (char *)0x0) {
            iVar4 = 0;
            ppcVar7 = ppcVar8;
            do {
              iVar4 = iVar4 + 1;
              ppcVar11 = ppcVar7 + 1;
              ppcVar1 = ppcVar7 + 2;
              ppcVar7 = ppcVar11;
            } while (*ppcVar1 != (char *)0x0);
          }
          iVar5 = iVar5 + local_140.error_count;
          perform_one_test_safe((FILE *)pFVar6,iVar4,ppcVar8 + 1,local_158,&local_140,pcVar9);
          iVar4 = 0;
          if (!bVar3) {
            iVar4 = local_140.warning_count;
          }
          pcVar10 = "FAIL";
          if (iVar4 + local_140.error_count == iVar5) {
            pcVar10 = "PASS";
          }
          printf("%s: %s %s\n",pcVar10,local_140.program,pcVar9);
          pcVar9 = ppcVar11[2];
          ppcVar8 = ppcVar11 + 2;
        } while (pcVar9 != (char *)0x0);
      }
    }
    else {
      local_140.test = "command line";
      perform_one_test((FILE *)pFVar6,argc_00,ppcVar8,local_158,&local_140,0);
      perform_one_test((FILE *)pFVar6,argc_00,ppcVar8,local_158,&local_140,1);
      local_140.test = "initialization";
    }
    fclose(pFVar6);
    iVar5 = 0;
    if (!bVar3) {
      iVar5 = local_140.warning_count;
    }
    if (iVar5 + local_140.error_count != 0) {
      return 1;
    }
    if (local_170 == (char *)0x0) {
      return 0;
    }
    pFVar6 = fopen(local_170,"wt");
    if (pFVar6 != (FILE *)0x0) {
      fwrite("PNG unknown tests succeeded\n",0x1c,1,pFVar6);
      fflush(pFVar6);
      iVar5 = ferror(pFVar6);
      iVar4 = fclose(pFVar6);
      if (iVar4 == 0 && iVar5 == 0) {
        return 0;
      }
      goto LAB_00102a18;
    }
  }
  main_cold_3();
LAB_00102a18:
  main_cold_2();
}

Assistant:

int
main(int argc, const char **argv)
{
   FILE *fp;
   png_uint_32 default_flags[4]; /*valid,unknown{before,after}*/
   int strict = 0, default_tests = 0;
   const char *count_argv = "default=save";
   const char *touch_file = NULL;
   display d;

   init_display(&d, argv[0]);

   while (++argv, --argc > 0)
   {
      if (strcmp(*argv, "--strict") == 0)
         strict = 1;

      else if (strcmp(*argv, "--default") == 0)
         default_tests = 1;

      else if (strcmp(*argv, "--touch") == 0)
      {
         if (argc > 1)
            touch_file = *++argv, --argc;

         else
            usage(d.program, "--touch: missing file name");
      }

      else
         break;
   }

   /* A file name is required, but there should be no other arguments if
    * --default was specified.
    */
   if (argc <= 0)
      usage(d.program, "missing test file");

   /* GCC BUG: if (default_tests && argc != 1) triggers some weird GCC argc
    * optimization which causes warnings with -Wstrict-overflow!
    */
   else if (default_tests)
      if (argc != 1)
         usage(d.program, "extra arguments");

   /* The name of the test file is the last argument; remove it. */
   d.file = argv[--argc];

   fp = fopen(d.file, "rb");
   if (fp == NULL)
   {
      perror(d.file);
      exit(99);
   }

   /* First find all the chunks, known and unknown, in the test file, a failure
    * here aborts the whole test.
    *
    * If 'save' is supported then the normal saving method should happen,
    * otherwise if 'read' is supported then the read callback will do the
    * same thing.  If both are supported the 'read' callback won't be
    * instantiated by default.  If 'save' is *not* supported then a user
    * callback is required even though we can call png_get_unknown_chunks.
    */
   if (check(fp, 1, &count_argv, default_flags, &d,
#     ifdef PNG_SAVE_UNKNOWN_CHUNKS_SUPPORTED
         0
#     else
         1
#     endif
      ) != PNG_HANDLE_CHUNK_ALWAYS)
   {
      fprintf(stderr, "%s: %s: internal error\n", d.program, d.file);
      exit(99);
   }

   /* Now find what the various supplied options cause to change: */
   if (!default_tests)
   {
      d.test = cmd; /* acts as a flag to say exit, do not longjmp */
#     ifdef PNG_SAVE_UNKNOWN_CHUNKS_SUPPORTED
         perform_one_test(fp, argc, argv, default_flags, &d, 0);
#     endif
#     ifdef PNG_READ_USER_CHUNKS_SUPPORTED
         perform_one_test(fp, argc, argv, default_flags, &d, 1);
#     endif
      d.test = init;
   }

   else
   {
      const char **test = standard_tests;

      /* Set the exit_test pointer here so we can continue after a libpng error.
       * NOTE: this leaks memory because the png_struct data from the failing
       * test is never freed.
       */
      while (*test)
      {
         const char *this_test = *test++;
         const char **next = test;
         int count = display_rc(&d, strict), new_count;
         const char *result;
         int arg_count = 0;

         while (*next != NULL)
         {
            ++next;
            ++arg_count;
         }

         perform_one_test_safe(fp, arg_count, test, default_flags, &d,
            this_test);

         new_count = display_rc(&d, strict);

         if (new_count == count)
            result = "PASS";

         else
            result = "FAIL";

         printf("%s: %s %s\n", result, d.program, this_test);

         test = next+1;
      }
   }

   fclose(fp);

   if (display_rc(&d, strict) == 0)
   {
      /* Success, touch the success file if appropriate */
      if (touch_file != NULL)
      {
         FILE *fsuccess = fopen(touch_file, "wt");

         if (fsuccess != NULL)
         {
            int err = 0;
            fprintf(fsuccess, "PNG unknown tests succeeded\n");
            fflush(fsuccess);
            err = ferror(fsuccess);

            if (fclose(fsuccess) || err)
            {
               fprintf(stderr, "%s: write failed\n", touch_file);
               exit(99);
            }
         }

         else
         {
            fprintf(stderr, "%s: open failed\n", touch_file);
            exit(99);
         }
      }

      return 0;
   }

   return 1;
}